

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void MatchFinder_Init_2(CMatchFinder *p,int readData)

{
  uint uVar1;
  CLzRef *pCVar2;
  int in_ESI;
  CMatchFinder *in_RDI;
  UInt32 num;
  UInt32 *hash;
  UInt32 i;
  uint uVar3;
  
  pCVar2 = in_RDI->hash;
  uVar1 = in_RDI->hashSizeSum;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    pCVar2[uVar3] = 0;
  }
  in_RDI->cyclicBufferPos = 0;
  in_RDI->buffer = in_RDI->bufferBase;
  in_RDI->streamPos = in_RDI->cyclicBufferSize;
  in_RDI->pos = in_RDI->cyclicBufferSize;
  in_RDI->result = 0;
  in_RDI->streamEndWasReached = '\0';
  if (in_ESI != 0) {
    MatchFinder_ReadBlock((CMatchFinder *)CONCAT44(in_ESI,uVar3));
  }
  MatchFinder_SetLimits(in_RDI);
  return;
}

Assistant:

void MatchFinder_Init_2(CMatchFinder *p, int readData)
{
  UInt32 i;
  UInt32 *hash = p->hash;
  UInt32 num = p->hashSizeSum;
  for (i = 0; i < num; i++)
    hash[i] = kEmptyHashValue;
  
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->pos = p->streamPos = p->cyclicBufferSize;
  p->result = SZ_OK;
  p->streamEndWasReached = 0;
  
  if (readData)
    MatchFinder_ReadBlock(p);
  
  MatchFinder_SetLimits(p);
}